

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_entry_point_declarations(CompilerMSL *this)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  int iVar1;
  MSLSamplerAddress MVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  MSLSamplerAddress addr;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  SPIRVariable *pSVar11;
  SPIRType *pSVar12;
  _Base_ptr p_Var13;
  SPIRType *pSVar14;
  long lVar15;
  mapped_type *pmVar16;
  CompilerError *pCVar17;
  SPIRVariable **ppSVar18;
  long lVar19;
  CompilerMSL *pCVar20;
  string *in_R8;
  char *in_R9;
  pair<unsigned_int,_unsigned_int> *ppVar21;
  ID *__k;
  uint *puVar22;
  allocator local_2f9;
  string alias_name;
  char *local_2b8;
  uint32_t base_index;
  SPIRVariable **local_2a8;
  string resource_name;
  string local_280;
  char *local_260;
  char *local_258;
  char *desc_addr_space;
  uint32_t desc_set;
  undefined4 uStack_22c;
  uint32_t desc_binding;
  _Rb_tree_node_base *local_1f0;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  declare_complex_constant_arrays(this);
  for (p_Var13 = (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var13 !=
      &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13)) {
    pSVar11 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,p_Var13[1]._M_color);
    pSVar12 = Compiler::get<spirv_cross::SPIRType>
                        ((Compiler *)this,*(uint32_t *)&(pSVar11->super_IVariant).field_0xc);
    if (pSVar12->basetype == Sampler) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,p_Var13[1]._M_color);
    }
    args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .buffer_size = 0;
    args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args.stack_storage;
    args.buffer_capacity = 8;
    if (*(int *)&p_Var13[1].field_0x4 != 0) {
      ::std::__cxx11::string::string
                ((string *)&resource_name,"coord::pixel",(allocator *)&alias_name);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&args,&resource_name);
      ::std::__cxx11::string::~string((string *)&resource_name);
    }
    iVar1 = *(int *)&p_Var13[1]._M_parent;
    iVar6 = *(int *)((long)&p_Var13[1]._M_parent + 4);
    if (iVar1 == iVar6) {
      if (iVar1 != 0) {
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"filter::linear",(allocator *)&alias_name);
LAB_00195c35:
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,&resource_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
      }
    }
    else {
      if (iVar1 != 0) {
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"min_filter::linear",(allocator *)&alias_name);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,&resource_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
        iVar6 = *(int *)((long)&p_Var13[1]._M_parent + 4);
      }
      if (iVar6 != 0) {
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"mag_filter::linear",(allocator *)&alias_name);
        goto LAB_00195c35;
      }
    }
    iVar1 = *(int *)&p_Var13[1]._M_left;
    if (iVar1 != 0) {
      if (iVar1 == 2) {
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"mip_filter::linear",(allocator *)&alias_name);
      }
      else {
        if (iVar1 != 1) {
          pCVar17 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar17,"Invalid mip filter.");
          goto LAB_0019700d;
        }
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"mip_filter::nearest",(allocator *)&alias_name);
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&args,&resource_name);
      ::std::__cxx11::string::~string((string *)&resource_name);
    }
    MVar2 = *(MSLSamplerAddress *)((long)&p_Var13[1]._M_left + 4);
    addr = *(MSLSamplerAddress *)&p_Var13[1]._M_right;
    if ((MVar2 == addr) && (MVar2 == *(MSLSamplerAddress *)((long)&p_Var13[1]._M_right + 4))) {
      if (MVar2 != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&resource_name,"",MVar2);
LAB_00195d47:
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,&resource_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
      }
    }
    else {
      if (MVar2 != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&resource_name,"s_",MVar2);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,&resource_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
        addr = *(MSLSamplerAddress *)&p_Var13[1]._M_right;
      }
      if (addr != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&resource_name,"t_",addr);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,&resource_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
      }
      MVar2 = *(MSLSamplerAddress *)((long)&p_Var13[1]._M_right + 4);
      if (MVar2 != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&resource_name,"r_",MVar2);
        goto LAB_00195d47;
      }
    }
    if (p_Var13[4].field_0x4 == '\x01') {
      switch(p_Var13[2]._M_color) {
      case _S_red:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::never",(allocator *)&alias_name);
        break;
      case _S_black:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::less",(allocator *)&alias_name);
        break;
      case 2:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::less_equal",(allocator *)&alias_name);
        break;
      case 3:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::greater",(allocator *)&alias_name);
        break;
      case 4:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::greater_equal",(allocator *)&alias_name);
        break;
      case 5:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::equal",(allocator *)&alias_name);
        break;
      case 6:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::not_equal",(allocator *)&alias_name);
        break;
      case 7:
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"compare_func::always",(allocator *)&alias_name);
        break;
      default:
        pCVar17 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar17,"Invalid sampler compare function.");
        goto LAB_0019700d;
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&args,&resource_name);
      ::std::__cxx11::string::~string((string *)&resource_name);
    }
    if (((*(int *)((long)&p_Var13[1]._M_left + 4) == 2) || (*(int *)&p_Var13[1]._M_right == 2)) ||
       (*(int *)((long)&p_Var13[1]._M_right + 4) == 2)) {
      iVar1 = *(int *)&p_Var13[2].field_0x4;
      if (iVar1 == 0) {
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"border_color::transparent_black",
                   (allocator *)&alias_name);
      }
      else if (iVar1 == 2) {
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"border_color::opaque_white",(allocator *)&alias_name);
      }
      else {
        if (iVar1 != 1) {
          pCVar17 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar17,"Invalid sampler border color.");
LAB_0019700d:
          __cxa_throw(pCVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string
                  ((string *)&resource_name,"border_color::opaque_black",(allocator *)&alias_name);
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&args,&resource_name);
      ::std::__cxx11::string::~string((string *)&resource_name);
    }
    if (p_Var13[4].field_0x6 == '\x01') {
      join<char_const(&)[16],int&,char_const(&)[2]>
                (&resource_name,(spirv_cross *)"max_anisotropy(",(char (*) [16])&p_Var13[2]._M_left,
                 (int *)0x2cdc84,(char (*) [2])in_R8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&args,&resource_name);
      ::std::__cxx11::string::~string((string *)&resource_name);
    }
    if (p_Var13[4].field_0x5 == '\x01') {
      CompilerGLSL::format_float_abi_cxx11_
                (&alias_name,&this->super_CompilerGLSL,*(float *)&p_Var13[2]._M_parent);
      CompilerGLSL::format_float_abi_cxx11_
                (&local_280,&this->super_CompilerGLSL,*(float *)((long)&p_Var13[2]._M_parent + 4));
      in_R9 = ")";
      in_R8 = &local_280;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (&resource_name,(spirv_cross *)0x2bee37,(char (*) [11])&alias_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bed76,
                 (char (*) [3])&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
                 (char (*) [2])pSVar12);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&args,&resource_name);
      ::std::__cxx11::string::~string((string *)&resource_name);
      ::std::__cxx11::string::~string((string *)&local_280);
      ::std::__cxx11::string::~string((string *)&alias_name);
    }
    if (args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .buffer_size == 0) {
      if (pSVar12->basetype == SampledImage) {
        to_sampler_expression_abi_cxx11_(&resource_name,this,p_Var13[1]._M_color);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&resource_name,this,(ulong)p_Var13[1]._M_color,1);
      }
      CompilerGLSL::statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",&resource_name,
                 (char (*) [2])0x2cce52);
    }
    else {
      if (pSVar12->basetype == SampledImage) {
        to_sampler_expression_abi_cxx11_(&resource_name,this,p_Var13[1]._M_color);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&resource_name,this,(ulong)p_Var13[1]._M_color,1);
      }
      merge(&alias_name,&args,", ");
      in_R9 = ");";
      in_R8 = &alias_name;
      CompilerGLSL::
      statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",&resource_name,
                 (char (*) [2])0x2c2359,&alias_name,(char (*) [3])0x2cce51);
      ::std::__cxx11::string::~string((string *)&alias_name);
    }
    ::std::__cxx11::string::~string((string *)&resource_name);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::~SmallVector(&args);
  }
  local_1f0 = &(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header
  ;
  for (p_Var13 = (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_left; p_Var13 != local_1f0;
      p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13)) {
    uVar7 = *(uint32_t *)((long)&p_Var13[1]._M_parent + 4);
    if (uVar7 != 0) {
      pSVar11 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar7);
      uVar10 = (pSVar11->super_IVariant).self.id;
      pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&args,this,(ulong)(pSVar11->super_IVariant).self.id,1);
      uVar7 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(pSVar11->super_IVariant).self.id,
                         DecorationDescriptorSet);
      uVar7 = this->argument_buffer_ids[uVar7];
      base_index = *(uint32_t *)&p_Var13[1]._M_parent;
      bVar4 = Compiler::is_array((Compiler *)this,pSVar12);
      if (bVar4) {
        this->is_using_builtin_array = true;
        get_argument_address_space_abi_cxx11_(&resource_name,this,pSVar11);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&alias_name,this,pSVar12,0);
        desc_addr_space = to_restrict(this,uVar10,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                  (&local_280,this,pSVar12,(ulong)uVar10);
        in_R9 = (char *)&desc_addr_space;
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string&,std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,&resource_name,(char (*) [2])0x2af68c,&alias_name,
                   (char (*) [3])0x2be2a9,(char **)in_R9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   &local_280,(char (*) [3])0x2b4155);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::__cxx11::string::~string((string *)&alias_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
        uVar8 = get_resource_array_size(this,pSVar12,uVar10);
        local_2a8 = (SPIRVariable **)CONCAT44(local_2a8._4_4_,uVar8);
        if (uVar8 == 0) {
          pCVar17 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar17,
                     "Size of runtime array with dynamic offset could not be determined from resource bindings."
                    );
          __cxa_throw(pCVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        uVar9 = 0;
        while( true ) {
          local_2b8 = (char *)CONCAT44(local_2b8._4_4_,uVar9);
          if ((uint)local_2a8 <= uVar9) break;
          get_argument_address_space_abi_cxx11_(&resource_name,this,pSVar11);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&alias_name,this,pSVar12,0);
          local_d0._M_dataplus._M_p = to_restrict(this,uVar10,false);
          get_argument_address_space_abi_cxx11_(&local_280,this,pSVar11);
          local_258 = to_restrict(this,uVar10,false);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &desc_addr_space,this,uVar7,1);
          ::std::__cxx11::string::string((string *)&local_90,(string *)&args);
          pCVar20 = (CompilerMSL *)0x2bf319;
          ::std::__cxx11::string::string((string *)&local_50,"m",&local_2f9);
          ensure_valid_name((string *)&desc_set,pCVar20,&local_90,&local_50);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &desc_binding,this,(ulong)this->dynamic_offsets_buffer_id,1);
          local_260 = (char *)CONCAT44(local_260._4_4_,(int)local_2b8 + base_index);
          in_R9 = "* ";
          CompilerGLSL::
          statement<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
                    (&this->super_CompilerGLSL,(char (*) [2])0x2c2359,&resource_name,
                     (char (*) [2])0x2af68c,&alias_name,(char (*) [3])0x2be2a9,(char **)&local_d0,
                     (char (*) [4])")((",&local_280,(char (*) [8])" char* ",&local_258,
                     (char (*) [2])0x2cdc84,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &desc_addr_space,(char (*) [2])0x2cda15,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_set,
                     (char (*) [2])0x2a2336,(uint *)&local_2b8,(char (*) [2])0x2ad9aa,
                     (char (*) [4])0x2b5f2e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &desc_binding,(char (*) [2])0x2a2336,(uint *)&local_260,(char (*) [4])"]),");
          ::std::__cxx11::string::~string((string *)&desc_binding);
          ::std::__cxx11::string::~string((string *)&desc_set);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::~string((string *)&desc_addr_space);
          ::std::__cxx11::string::~string((string *)&local_280);
          ::std::__cxx11::string::~string((string *)&alias_name);
          ::std::__cxx11::string::~string((string *)&resource_name);
          uVar9 = (int)local_2b8 + 1;
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        CompilerGLSL::statement_no_indent<char_const(&)[1]>
                  (&this->super_CompilerGLSL,(char (*) [1])0x2a9b09);
        this->is_using_builtin_array = false;
      }
      else {
        get_argument_address_space_abi_cxx11_(&resource_name,this,pSVar11);
        local_258 = to_restrict(this,uVar10,true);
        get_argument_address_space_abi_cxx11_(&alias_name,this,pSVar11);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_280,this,pSVar12,0)
        ;
        local_2b8 = to_restrict(this,uVar10,false);
        get_argument_address_space_abi_cxx11_((string *)&desc_addr_space,this,pSVar11);
        local_260 = to_restrict(this,uVar10,false);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&desc_set,this,uVar7,1);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&args);
        pCVar20 = (CompilerMSL *)0x2bf319;
        ::std::__cxx11::string::string((string *)&local_70,"m",&local_2f9);
        ensure_valid_name((string *)&desc_binding,pCVar20,&local_b0,&local_70);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_d0,this,(ulong)this->dynamic_offsets_buffer_id,1);
        in_R9 = " = *(";
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                  (&this->super_CompilerGLSL,&resource_name,(char (*) [8])" auto& ",&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [6])" = *(",&alias_name,(char (*) [2])0x2af68c,&local_280,
                   (char (*) [3])0x2be2a9,&local_2b8,(char (*) [4])")((",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &desc_addr_space,(char (*) [8])" char* ",&local_260,(char (*) [2])0x2cdc84,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_set,
                   (char (*) [2])0x2cda15,(string *)&desc_binding,(char (*) [4])0x2b5f2e,&local_d0,
                   (char (*) [2])0x2a2336,&base_index,(char (*) [4])0x2ac61f);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&desc_binding);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&desc_set);
        ::std::__cxx11::string::~string((string *)&desc_addr_space);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::__cxx11::string::~string((string *)&alias_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
      }
      ::std::__cxx11::string::~string((string *)&args);
    }
  }
  ppSVar18 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr;
  local_2a8 = ppSVar18 +
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
  ;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  bVar4 = false;
  do {
    if (ppSVar18 == local_2a8) {
      if (bVar4) {
        CompilerGLSL::statement_no_indent<char_const(&)[1]>
                  (&this->super_CompilerGLSL,(char (*) [1])0x2a9b09);
      }
      puVar22 = (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr;
      lVar15 = (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size << 2;
      for (lVar19 = 0; lVar15 != lVar19; lVar19 = lVar19 + 4) {
        pSVar11 = Compiler::get<spirv_cross::SPIRVariable>
                            ((Compiler *)this,*(uint32_t *)((long)puVar22 + lVar19));
        pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
        get_argument_address_space_abi_cxx11_((string *)&args,this,pSVar11);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&resource_name,this,(ulong)*(uint *)((long)puVar22 + lVar19),1);
        uVar7 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)((long)puVar22 + lVar19),
                           DecorationDescriptorSet);
        desc_set = uVar7;
        desc_binding = Compiler::get_decoration
                                 ((Compiler *)this,(ID)*(uint32_t *)((long)puVar22 + lVar19),
                                  DecorationBinding);
        join<char_const(&)[18],unsigned_int&,char_const(&)[8],unsigned_int&>
                  (&alias_name,(spirv_cross *)"spvBufferAliasSet",(char (*) [18])&desc_set,
                   (uint *)"Binding",(char (*) [8])&desc_binding,(uint *)in_R9);
        desc_addr_space = to_restrict(this,*(uint32_t *)((long)puVar22 + lVar19),true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_280,this,pSVar12,0)
        ;
        in_R9 = " = *(";
        CompilerGLSL::
        statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [8])" auto& ",&desc_addr_space,&resource_name,(char (*) [6])" = *(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [2])0x2af68c,&local_280,(char (*) [3])0x2cbd82,&alias_name,
                   (char (*) [2])0x2cce52);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::__cxx11::string::~string((string *)&alias_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
        ::std::__cxx11::string::~string((string *)&args);
      }
      (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size = 0;
      ppVar21 = (this->buffer_aliases_argument).
                super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
      for (lVar15 = (this->buffer_aliases_argument).
                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size << 3;
          lVar15 != 0; lVar15 = lVar15 + -8) {
        uVar10 = ppVar21->first;
        uVar9 = ppVar21->second;
        pSVar11 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar10);
        pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
        get_argument_address_space_abi_cxx11_((string *)&args,this,pSVar11);
        if ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          local_280._M_dataplus._M_p = to_restrict(this,uVar10,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&resource_name,this,(ulong)uVar10,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&alias_name,this,pSVar12,0);
          desc_addr_space = (char *)CONCAT44(desc_addr_space._4_4_,uVar9);
          pmVar16 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&desc_addr_space);
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [8])" auto& ",(char **)&local_280,&resource_name,
                     (char (*) [5])0x2bf1ca,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [2])0x2af68c,&alias_name,(char (*) [3])0x2cd52a,
                     &(pmVar16->decoration).qualified_alias,(char (*) [2])0x2cce52);
          ::std::__cxx11::string::~string((string *)&alias_name);
          ::std::__cxx11::string::~string((string *)&resource_name);
        }
        else {
          desc_addr_space = descriptor_address_space(this,uVar10,pSVar11->storage,"thread");
          this->is_using_builtin_array = true;
          _desc_set = to_restrict(this,uVar10,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&resource_name,this,(ulong)uVar10,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&alias_name,this,pSVar12,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                    (&local_280,this,pSVar12,(ulong)uVar10);
          desc_binding = uVar9;
          pmVar16 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&desc_binding);
          CompilerGLSL::
          statement<char_const*&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[5],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,&desc_addr_space,(char (*) [8])" auto& ",
                     (char **)&desc_set,&resource_name,(char (*) [5])0x2bf1ca,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [2])0x2af68c,&alias_name,(char (*) [3])0x2be2a9,&desc_addr_space,
                     (char (*) [5])" (&)",&local_280,(char (*) [2])0x2cdc84,
                     &(pmVar16->decoration).qualified_alias,(char (*) [2])0x2cce52);
          ::std::__cxx11::string::~string((string *)&local_280);
          ::std::__cxx11::string::~string((string *)&alias_name);
          ::std::__cxx11::string::~string((string *)&resource_name);
          this->is_using_builtin_array = false;
        }
        ::std::__cxx11::string::~string((string *)&args);
        ppVar21 = ppVar21 + 1;
      }
      puVar22 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr;
      ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar22,puVar22 + (this->disabled_frag_outputs).super_VectorView<unsigned_int>.
                                   buffer_size);
      puVar22 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr;
      sVar3 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.buffer_size;
      for (lVar15 = 0; sVar3 << 2 != lVar15; lVar15 = lVar15 + 4) {
        uVar7 = *(uint32_t *)((long)puVar22 + lVar15);
        pSVar11 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar7);
        CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar7);
        CompilerGLSL::variable_decl_abi_cxx11_((string *)&args,&this->super_CompilerGLSL,pSVar11);
        CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [2])0x2cce52);
        ::std::__cxx11::string::~string((string *)&args);
        pSVar11->deferred_declaration = false;
      }
      return;
    }
    pSVar11 = *ppSVar18;
    pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
    pSVar14 = Compiler::get_variable_element_type((Compiler *)this,pSVar11);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&args,this,(ulong)(pSVar11->super_IVariant).self.id,1);
    bVar5 = is_var_runtime_size_array(this,pSVar11);
    __k = &(pSVar11->super_IVariant).self;
    if (!bVar5) {
      if (((pSVar12->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
         (pSVar12->basetype == Struct)) {
        get_argument_address_space_abi_cxx11_(&resource_name,this,pSVar11);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&alias_name,this,pSVar14,0);
        local_280._M_dataplus._M_p = to_restrict(this,__k->id,true);
        in_R9 = (char *)&local_280;
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string_const&,char_const(&)[5]>
                  (&this->super_CompilerGLSL,&resource_name,(char (*) [2])0x2af68c,&alias_name,
                   (char (*) [3])0x2be2a9,(char **)in_R9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [5])"[] =");
        ::std::__cxx11::string::~string((string *)&alias_name);
        ::std::__cxx11::string::~string((string *)&resource_name);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        uVar7 = get_resource_array_size(this,pSVar12,__k->id);
        uVar10 = 0;
        while( true ) {
          resource_name._M_dataplus._M_p._0_4_ = uVar10;
          if (uVar7 <= uVar10) break;
          CompilerGLSL::
          statement<std::__cxx11::string_const&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [2])0x2ae00b,(uint *)&resource_name,(char (*) [2])0x2b40c0);
          uVar10 = (uint)resource_name._M_dataplus._M_p + 1;
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        CompilerGLSL::statement_no_indent<char_const(&)[1]>
                  (&this->super_CompilerGLSL,(char (*) [1])0x2a9b09);
      }
      goto LAB_00196a83;
    }
    if ((int)(this->msl_options).argument_buffers_tier < 1) {
      pCVar17 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar17,"Unsized array of descriptors requires argument buffer tier 2");
      __cxa_throw(pCVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    resource_name._M_dataplus._M_p = (pointer)&resource_name.field_2;
    resource_name._M_string_length = 0;
    resource_name.field_2._M_local_buf[0] = '\0';
    uVar7 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationDescriptorSet);
    if (((uVar7 < 8) && ((this->msl_options).argument_buffers != false)) &&
       ((this->argument_buffer_discrete_mask >> (uVar7 & 0x1f) & 1) == 0)) {
      ::std::__detail::
      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)this_00,__k);
      ::std::__cxx11::string::_M_assign((string *)&resource_name);
    }
    else {
      ::std::operator+(&alias_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                       "_");
      ::std::__cxx11::string::operator=((string *)&resource_name,(string *)&alias_name);
      ::std::__cxx11::string::~string((string *)&alias_name);
    }
    switch(pSVar12->basetype) {
    case Struct:
      get_argument_address_space_abi_cxx11_(&alias_name,this,pSVar11);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_280,this,pSVar14,0);
      in_R9 = "*> ";
      CompilerGLSL::
      statement<char_const(&)[20],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&alias_name,
                 (char (*) [2])0x2af68c,&local_280,(char (*) [4])"*> ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 (char (*) [3])0x2aeef6,&resource_name,(char (*) [3])0x2b6758);
      ::std::__cxx11::string::~string((string *)&local_280);
      goto LAB_00196a6d;
    case Image:
    case Sampler:
    case AccelerationStructure:
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&alias_name,this,pSVar14,(ulong)__k->id);
      in_R9 = " {";
      CompilerGLSL::
      statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&alias_name,
                 (char (*) [3])0x2cce09,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 (char (*) [3])0x2aeef6,&resource_name,(char (*) [3])0x2b6758);
LAB_00196a6d:
      ::std::__cxx11::string::~string((string *)&alias_name);
      break;
    case SampledImage:
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&alias_name,this,pSVar14,(ulong)__k->id);
      CompilerGLSL::
      statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&alias_name,
                 (char (*) [3])0x2cce09,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 (char (*) [3])0x2aeef6,&resource_name,(char (*) [3])0x2b6758);
      ::std::__cxx11::string::~string((string *)&alias_name);
      in_R9 = "Smplr_};";
      CompilerGLSL::
      statement<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string_const&,char_const(&)[9]>
                (&this->super_CompilerGLSL,(char (*) [29])"spvDescriptorArray<sampler> ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 (char (*) [8])"Smplr {",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 (char (*) [9])"Smplr_};");
    }
    ::std::__cxx11::string::~string((string *)&resource_name);
    bVar4 = true;
LAB_00196a83:
    ::std::__cxx11::string::~string((string *)&args);
    ppSVar18 = ppSVar18 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::emit_entry_point_declarations()
{
	// FIXME: Get test coverage here ...
	// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries
	declare_complex_constant_arrays();

	// Emit constexpr samplers here.
	for (auto &samp : constexpr_samplers_by_id)
	{
		auto &var = get<SPIRVariable>(samp.first);
		auto &type = get<SPIRType>(var.basetype);
		if (type.basetype == SPIRType::Sampler)
			add_resource_name(samp.first);

		SmallVector<string> args;
		auto &s = samp.second;

		if (s.coord != MSL_SAMPLER_COORD_NORMALIZED)
			args.push_back("coord::pixel");

		if (s.min_filter == s.mag_filter)
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("filter::linear");
		}
		else
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("min_filter::linear");
			if (s.mag_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("mag_filter::linear");
		}

		switch (s.mip_filter)
		{
		case MSL_SAMPLER_MIP_FILTER_NONE:
			// Default
			break;
		case MSL_SAMPLER_MIP_FILTER_NEAREST:
			args.push_back("mip_filter::nearest");
			break;
		case MSL_SAMPLER_MIP_FILTER_LINEAR:
			args.push_back("mip_filter::linear");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid mip filter.");
		}

		if (s.s_address == s.t_address && s.s_address == s.r_address)
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("", s.s_address));
		}
		else
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("s_", s.s_address));
			if (s.t_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("t_", s.t_address));
			if (s.r_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("r_", s.r_address));
		}

		if (s.compare_enable)
		{
			switch (s.compare_func)
			{
			case MSL_SAMPLER_COMPARE_FUNC_ALWAYS:
				args.push_back("compare_func::always");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NEVER:
				args.push_back("compare_func::never");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_EQUAL:
				args.push_back("compare_func::equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NOT_EQUAL:
				args.push_back("compare_func::not_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS:
				args.push_back("compare_func::less");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS_EQUAL:
				args.push_back("compare_func::less_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER:
				args.push_back("compare_func::greater");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER_EQUAL:
				args.push_back("compare_func::greater_equal");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler compare function.");
			}
		}

		if (s.s_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER || s.t_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER ||
		    s.r_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)
		{
			switch (s.border_color)
			{
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_BLACK:
				args.push_back("border_color::opaque_black");
				break;
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_WHITE:
				args.push_back("border_color::opaque_white");
				break;
			case MSL_SAMPLER_BORDER_COLOR_TRANSPARENT_BLACK:
				args.push_back("border_color::transparent_black");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler border color.");
			}
		}

		if (s.anisotropy_enable)
			args.push_back(join("max_anisotropy(", s.max_anisotropy, ")"));
		if (s.lod_clamp_enable)
		{
			args.push_back(join("lod_clamp(", format_float(s.lod_clamp_min), ", ", format_float(s.lod_clamp_max), ")"));
		}

		// If we would emit no arguments, then omit the parentheses entirely. Otherwise,
		// we'll wind up with a "most vexing parse" situation.
		if (args.empty())
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          ";");
		else
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          "(", merge(args), ");");
	}

	// Emit dynamic buffers here.
	for (auto &dynamic_buffer : buffers_requiring_dynamic_offset)
	{
		if (!dynamic_buffer.second.second)
		{
			// Could happen if no buffer was used at requested binding point.
			continue;
		}

		const auto &var = get<SPIRVariable>(dynamic_buffer.second.second);
		uint32_t var_id = var.self;
		const auto &type = get_variable_data_type(var);
		string name = to_name(var.self);
		uint32_t desc_set = get_decoration(var.self, DecorationDescriptorSet);
		uint32_t arg_id = argument_buffer_ids[desc_set];
		uint32_t base_index = dynamic_buffer.second.first;

		if (is_array(type))
		{
			is_using_builtin_array = true;
			statement(get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, true), name,
			          type_to_array_glsl(type, var_id), " =");

			uint32_t array_size = get_resource_array_size(type, var_id);
			if (array_size == 0)
				SPIRV_CROSS_THROW("Size of runtime array with dynamic offset could not be determined from resource bindings.");

			begin_scope();

			for (uint32_t i = 0; i < array_size; i++)
			{
				statement("(", get_argument_address_space(var), " ", type_to_glsl(type), "* ",
				          to_restrict(var_id, false), ")((", get_argument_address_space(var), " char* ",
				          to_restrict(var_id, false), ")", to_name(arg_id), ".", ensure_valid_name(name, "m"),
				          "[", i, "]", " + ", to_name(dynamic_offsets_buffer_id), "[", base_index + i, "]),");
			}

			end_scope_decl();
			statement_no_indent("");
			is_using_builtin_array = false;
		}
		else
		{
			statement(get_argument_address_space(var), " auto& ", to_restrict(var_id, true), name, " = *(",
			          get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, false), ")((",
			          get_argument_address_space(var), " char* ", to_restrict(var_id, false), ")", to_name(arg_id), ".",
			          ensure_valid_name(name, "m"), " + ", to_name(dynamic_offsets_buffer_id), "[", base_index, "]);");
		}
	}

	bool has_runtime_array_declaration = false;
	for (SPIRVariable *arg : entry_point_bindings)
	{
		const auto &var = *arg;
		const auto &type = get_variable_data_type(var);
		const auto &buffer_type = get_variable_element_type(var);
		const string name = to_name(var.self);

		if (is_var_runtime_size_array(var))
		{
			if (msl_options.argument_buffers_tier < Options::ArgumentBuffersTier::Tier2)
			{
				SPIRV_CROSS_THROW("Unsized array of descriptors requires argument buffer tier 2");
			}

			string resource_name;
			if (descriptor_set_is_argument_buffer(get_decoration(var.self, DecorationDescriptorSet)))
				resource_name = ir.meta[var.self].decoration.qualified_alias;
			else
				resource_name = name + "_";

			switch (type.basetype)
			{
			case SPIRType::Image:
			case SPIRType::Sampler:
			case SPIRType::AccelerationStructure:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				break;
			case SPIRType::SampledImage:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				// Unsupported with argument buffer for now.
				statement("spvDescriptorArray<sampler> ", name, "Smplr {", name, "Smplr_};");
				break;
			case SPIRType::Struct:
				statement("spvDescriptorArray<", get_argument_address_space(var), " ", type_to_glsl(buffer_type), "*> ",
				          name, " {", resource_name, "};");
				break;
			default:
				break;
			}
			has_runtime_array_declaration = true;
		}
		else if (!type.array.empty() && type.basetype == SPIRType::Struct)
		{
			// Emit only buffer arrays here.
			statement(get_argument_address_space(var), " ", type_to_glsl(buffer_type), "* ",
			          to_restrict(var.self, true), name, "[] =");
			begin_scope();
			uint32_t array_size = get_resource_array_size(type, var.self);
			for (uint32_t i = 0; i < array_size; ++i)
				statement(name, "_", i, ",");
			end_scope_decl();
			statement_no_indent("");
		}
	}

	if (has_runtime_array_declaration)
		statement_no_indent("");

	// Emit buffer aliases here.
	for (auto &var_id : buffer_aliases_discrete)
	{
		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);
		auto name = to_name(var_id);

		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		uint32_t desc_binding = get_decoration(var_id, DecorationBinding);
		auto alias_name = join("spvBufferAliasSet", desc_set, "Binding", desc_binding);

		statement(addr_space, " auto& ", to_restrict(var_id, true),
		          name,
		          " = *(", addr_space, " ", type_to_glsl(type), "*)", alias_name, ";");
	}
	// Discrete descriptors are processed in entry point emission every compiler iteration.
	buffer_aliases_discrete.clear();

	for (auto &var_pair : buffer_aliases_argument)
	{
		uint32_t var_id = var_pair.first;
		uint32_t alias_id = var_pair.second;

		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);

		if (type.array.empty())
		{
			statement(addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "&)", ir.meta[alias_id].decoration.qualified_alias, ";");
		}
		else
		{
			const char *desc_addr_space = descriptor_address_space(var_id, var.storage, "thread");

			// Esoteric type cast. Reference to array of pointers.
			// Auto here defers to UBO or SSBO. The address space of the reference needs to refer to the
			// address space of the argument buffer itself, which is usually constant, but can be const device for
			// large argument buffers.
			is_using_builtin_array = true;
			statement(desc_addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "* ", desc_addr_space, " (&)",
			          type_to_array_glsl(type, var_id), ")", ir.meta[alias_id].decoration.qualified_alias, ";");
			is_using_builtin_array = false;
		}
	}

	// Emit disabled fragment outputs.
	std::sort(disabled_frag_outputs.begin(), disabled_frag_outputs.end());
	for (uint32_t var_id : disabled_frag_outputs)
	{
		auto &var = get<SPIRVariable>(var_id);
		add_local_variable_name(var_id);
		statement(CompilerGLSL::variable_decl(var), ";");
		var.deferred_declaration = false;
	}
}